

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O3

void gdImageFillToBorder(gdImagePtr im,int x,int y,int border,int color)

{
  int iVar1;
  bool bVar2;
  int x_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  int x_01;
  
  if (-1 < border) {
    iVar1 = im->alphaBlendingFlag;
    im->alphaBlendingFlag = 0;
    if (-1 < x) {
      iVar4 = gdImageGetPixel(im,x,y);
      iVar5 = x;
      x_01 = -1;
      while (x_00 = iVar5, iVar4 != border) {
        gdImageSetPixel(im,x_00,y,color);
        if (x_00 < 1) {
          x_01 = 0;
          goto LAB_0010f5fc;
        }
        iVar4 = gdImageGetPixel(im,x_00 + -1,y);
        iVar5 = x_00 + -1;
        x_01 = x_00;
      }
      if (x_01 != -1) {
LAB_0010f5fc:
        while ((iVar5 = x + 1, iVar5 < im->sx &&
               (iVar4 = gdImageGetPixel(im,iVar5,y), iVar4 != border))) {
          gdImageSetPixel(im,iVar5,y,color);
          x = iVar5;
        }
        if ((0 < y) && (x_01 <= x)) {
          bVar2 = true;
          iVar5 = x_01;
          do {
            iVar4 = gdImageGetPixel(im,iVar5,y + -1);
            bVar3 = iVar4 == color || iVar4 == border;
            if ((bVar2) && (bVar3 = true, iVar4 != color && iVar4 != border)) {
              gdImageFillToBorder(im,iVar5,y + -1,border,color);
              bVar3 = false;
            }
            bVar2 = bVar3;
            iVar5 = iVar5 + 1;
          } while (x + 1 != iVar5);
        }
        if ((y < im->sy + -1) && (x_01 <= x)) {
          bVar2 = true;
          do {
            iVar5 = gdImageGetPixel(im,x_01,y + 1);
            bVar3 = iVar5 == color || iVar5 == border;
            if ((bVar2) && (bVar3 = true, iVar5 != color && iVar5 != border)) {
              gdImageFillToBorder(im,x_01,y + 1,border,color);
              bVar3 = false;
            }
            bVar2 = bVar3;
            x_01 = x_01 + 1;
          } while (x + 1 != x_01);
        }
      }
    }
    im->alphaBlendingFlag = iVar1;
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageFillToBorder (gdImagePtr im, int x, int y, int border, int color)
{
	int lastBorder;
	/* Seek left */
	int leftLimit, rightLimit;
	int i;
	int restoreAlphaBleding;

	if (border < 0) {
		/* Refuse to fill to a non-solid border */
		return;
	}

	leftLimit = (-1);

	restoreAlphaBleding = im->alphaBlendingFlag;
	im->alphaBlendingFlag = 0;

	for (i = x; (i >= 0); i--) {
		if (gdImageGetPixel (im, i, y) == border) {
			break;
		}
		gdImageSetPixel (im, i, y, color);
		leftLimit = i;
	}
	if (leftLimit == (-1)) {
		im->alphaBlendingFlag = restoreAlphaBleding;
		return;
	}
	/* Seek right */
	rightLimit = x;
	for (i = (x + 1); (i < im->sx); i++) {
		if (gdImageGetPixel (im, i, y) == border) {
			break;
		}
		gdImageSetPixel (im, i, y, color);
		rightLimit = i;
	}
	/* Look at lines above and below and start paints */
	/* Above */
	if (y > 0) {
		lastBorder = 1;
		for (i = leftLimit; (i <= rightLimit); i++) {
			int c;
			c = gdImageGetPixel (im, i, y - 1);
			if (lastBorder) {
				if ((c != border) && (c != color)) {
					gdImageFillToBorder (im, i, y - 1, border, color);
					lastBorder = 0;
				}
			} else if ((c == border) || (c == color)) {
				lastBorder = 1;
			}
		}
	}
	/* Below */
	if (y < ((im->sy) - 1)) {
		lastBorder = 1;
		for (i = leftLimit; (i <= rightLimit); i++) {
			int c = gdImageGetPixel (im, i, y + 1);
			if (lastBorder) {
				if ((c != border) && (c != color)) {
					gdImageFillToBorder (im, i, y + 1, border, color);
					lastBorder = 0;
				}
			} else if ((c == border) || (c == color)) {
				lastBorder = 1;
			}
		}
	}
	im->alphaBlendingFlag = restoreAlphaBleding;
}